

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O1

void __thiscall
kratos::FSM::generate_output
          (FSM *this,Enum *enum_def,EnumVar *current_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  ulong uVar1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  *pvVar2;
  ulong uVar3;
  size_type __n;
  size_type __n_00;
  _func_int **pp_Var4;
  mapped_type pVVar5;
  key_type pVVar6;
  key_type pVVar7;
  Generator *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  pointer ppFVar9;
  pointer psVar10;
  pointer ppFVar11;
  undefined1 auVar12 [8];
  mapped_type *ppVVar13;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar14;
  mapped_type *__args;
  Context *pCVar15;
  _func_int **pp_Var16;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar17;
  pointer *this_01;
  key_type *__k;
  string_view format_str;
  format_args args;
  undefined1 local_170 [8];
  shared_ptr<kratos::CombinationalStmtBlock> output_comb;
  undefined1 auStack_138 [8];
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined1 local_100 [16];
  undefined1 local_f0 [8];
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  size_type *psStack_b8;
  string state_name;
  shared_ptr<kratos::SwitchStmt> output_case_comb;
  FSMState *state;
  Context *pCStack_78;
  Var *iter;
  size_type *local_68;
  _Base_ptr p_Stack_60;
  _Base_ptr local_58;
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  _Alloc_hider local_38;
  
  Generator::combinational((Generator *)local_170);
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  state_name.field_2._8_8_ = 0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<kratos::SwitchStmt,std::allocator<kratos::SwitchStmt>,std::shared_ptr<kratos::Var>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&output_case_comb,
             (SwitchStmt **)((long)&state_name.field_2 + 8),
             (allocator<kratos::SwitchStmt> *)&psStack_b8,
             (shared_ptr<kratos::Var> *)&stack0xffffffffffffff88);
  std::__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2>::
  _M_enable_shared_from_this_with<kratos::SwitchStmt,kratos::SwitchStmt>
            ((__shared_ptr<kratos::SwitchStmt,(__gnu_cxx::_Lock_policy)2> *)
             (state_name.field_2._M_local_buf + 8),(SwitchStmt *)state_name.field_2._8_8_);
  if (iter != (Var *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
  }
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)local_f0,this,false)
  ;
  uVar3 = (enum_def->values)._M_t._M_impl.super__Rb_tree_header._M_node_count;
  uVar1 = uVar3 - 1;
  _Var8 = output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount;
  auVar12 = local_f0;
  ppFVar9 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((uVar3 ^ uVar1) <= uVar1) {
    pCStack_78 = (Context *)0x0;
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
      _M_realloc_insert<decltype(nullptr)>
                ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)local_f0,
                 (iterator)
                 states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,&stack0xffffffffffffff88);
      _Var8 = output_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount;
      auVar12 = local_f0;
      ppFVar9 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
       super__Vector_impl_data._M_start = (FSMState *)0x0;
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start =
           states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      auVar12 = local_f0;
      ppFVar9 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    }
  }
  do {
    output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)auVar12;
    ppFVar11 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
               _M_impl.super__Vector_impl_data._M_start;
    if (output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi ==
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      if ((Var *)output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != (Var *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          pvVar2 = &(((Stmt *)&((Var *)output_case_comb.
                                       super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_IRNode)->super_IRNode).fn_name_ln;
          *(int *)&(pvVar2->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar2->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          pvVar2 = &(((Stmt *)&((Var *)output_case_comb.
                                       super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->super_IRNode)->super_IRNode).fn_name_ln;
          *(int *)&(pvVar2->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(pvVar2->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Var8._M_pi;
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar9;
      pCStack_78 = (Context *)state_name.field_2._8_8_;
      iter = (Var *)output_case_comb.
                    super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      StmtBlock::add_stmt((StmtBlock *)local_170,
                          (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffff88);
      if (iter != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
      }
      if (local_f0 != (undefined1  [8])0x0) {
        operator_delete((void *)local_f0,
                        (long)states.
                              super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)local_f0);
      }
      if (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   output_case_comb.
                   super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
      if (output_comb.super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   output_comb.
                   super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      return;
    }
    this_01 = &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
    output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
            (((pointer)
             output_comb.
             super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->first)._M_dataplus._M_p;
    psStack_b8 = &state_name._M_string_length;
    state_name._M_dataplus._M_p = (pointer)0x0;
    state_name._M_string_length._0_1_ = 0;
    if (output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar9;
      std::__cxx11::string::_M_replace((ulong)&psStack_b8,0,(char *)0x0,0x24271c);
      output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (this->start_state_).super___shared_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_38._M_p = (pointer)0x0;
      pCVar15 = (Context *)0x0;
    }
    else {
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppFVar9;
      std::__detail::
      _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)state_name_mapping,
           (key_type *)
           &output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount);
      std::__cxx11::string::_M_assign((string *)&psStack_b8);
      Enum::get_enum((Enum *)&stack0xffffffffffffff88,(string *)enum_def);
      pCVar15 = pCStack_78;
      local_38._M_p = (pointer)iter;
      pCStack_78 = (Context *)0x0;
      iter = (Var *)0x0;
    }
    _Var8._M_pi = output_case_comb.
                  super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
    auStack_138 = (undefined1  [8])0x0;
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    stmts.
    super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    __n._0_4_ = output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[7]._M_use_count;
    __n._4_4_ = output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi[7]._M_weak_count;
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    reserve((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)auStack_138,__n);
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __n_00._0_4_ = _Var8._M_pi[7]._M_use_count;
    __n_00._4_4_ = _Var8._M_pi[7]._M_weak_count;
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)this_01,__n_00);
    pp_Var4 = *(_func_int ***)&_Var8._M_pi[8]._M_use_count;
    for (pp_Var16 = _Var8._M_pi[8]._vptr__Sp_counted_base; pp_Var16 != pp_Var4;
        pp_Var16 = pp_Var16 + 1) {
      pCStack_78 = (Context *)*pp_Var16;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)this_01,
                 (Var **)&stack0xffffffffffffff88);
    }
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      __k = (key_type *)
            states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage;
      do {
        ppVVar13 = std::
                   map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                   ::at((map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                         *)(_Var8._M_pi + 5),__k);
        pVVar5 = *ppVVar13;
        if ((pVVar5 != (mapped_type)0x0) && (pVVar5 != *__k)) {
          pVVar6 = *__k;
          std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                    ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)
                     &stack0xffffffffffffff88,
                     (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                     &pVVar5->super_enable_shared_from_this<kratos::Var>);
          Var::assign((Var *)&stmts.
                              super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                      (shared_ptr<kratos::Var> *)pVVar6);
          if (iter != (Var *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
          }
          if (this->generator_->debug == true) {
            pCStack_78 = (Context *)0x0;
            iter = *(Var **)&output_case_comb.
                             super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                             _M_refcount._M_pi[0xd]._M_use_count;
            local_68 = (size_type *)0x0;
            p_Stack_60 = *(_Base_ptr *)
                          &output_case_comb.
                           super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[0xe]._M_use_count;
            local_58 = (_Base_ptr)
                       output_case_comb.
                       super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi[0xf]._vptr__Sp_counted_base;
            p_Stack_50 = *(_Base_ptr *)
                          &output_case_comb.
                           super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi[0xf]._M_use_count;
            local_48 = (_Base_ptr)0x0;
            local_100._0_8_ = (Enum *)&stack0xffffffffffffff88;
            std::
            _Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::
            _M_assign<std::_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,false>>>>
                      ((_Hashtable<kratos::Var*,std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>,std::allocator<std::pair<kratos::Var*const,std::pair<std::__cxx11::string,unsigned_int>>>,std::__detail::_Select1st,std::equal_to<kratos::Var*>,std::hash<kratos::Var*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)&stack0xffffffffffffff88,
                       (_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)(output_case_comb.
                           super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 0xd),
                       (_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>_>_>
                        *)local_100);
            psVar10 = stmts.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage;
            pVVar6 = *__k;
            aVar17 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                      )((anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
                         *)(&((__weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2> *)
                             &(pCStack_78->modules_)._M_h._M_buckets)->_M_ptr +
                           (ulong)pVVar6 % (ulong)iter))->values_;
            aVar14.values_ =
                 (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                  *)0x0;
            if (((element_type *)aVar17.values_ != (element_type *)0x0) &&
               (in_R9.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)(((weak_ptr<kratos::Enum> *)&((aVar17.values_)->field_0).named_args.data)->
                        super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               aVar14 = aVar17, aVar17.values_ = in_R9.values_,
               pVVar6 != (key_type)
                         ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &((in_R9.values_)->field_0).string.size)->_M_pi)) {
              while (in_R9.values_ =
                          (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                           *)(((weak_ptr<kratos::Enum> *)
                              &((aVar17.values_)->field_0).named_args.data)->
                             super___weak_ptr<kratos::Enum,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                    (element_type *)in_R9.values_ != (element_type *)0x0) {
                pVVar7 = (key_type)
                         ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
                         &((in_R9.values_)->field_0).string.size)->_M_pi;
                aVar14.values_ =
                     (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                      *)0x0;
                if (((ulong)pVVar7 % (ulong)iter != (ulong)pVVar6 % (ulong)iter) ||
                   (aVar14 = aVar17, aVar17.values_ = in_R9.values_, pVVar6 == pVVar7))
                goto LAB_001c79a8;
              }
              aVar14.values_ =
                   (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                    *)0x0;
            }
LAB_001c79a8:
            if (((element_type *)aVar14.values_ != (element_type *)0x0) &&
               (((aVar14.values_)->field_0).long_long_value != 0)) {
              __args = std::__detail::
                       _Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::at((_Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&stack0xffffffffffffff88,__k);
              std::
              vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
              ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                        ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                          *)&(psVar10->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)
                             ._M_refcount,__args);
            }
            std::
            _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)&stack0xffffffffffffff88);
          }
          std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
          emplace_back<std::shared_ptr<kratos::AssignStmt>&>
                    ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                      *)auStack_138,
                     (shared_ptr<kratos::AssignStmt> *)
                     &stmts.
                      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr);
          }
        }
        __k = __k + 1;
      } while (__k != (key_type *)0x0);
    }
    if (auStack_138 !=
        (undefined1  [8])
        stmts.
        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      iter = (Var *)local_38._M_p;
      if ((Var *)local_38._M_p != (Var *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)(local_38._M_p + 8))->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)(local_38._M_p + 8))->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
          UNLOCK();
        }
        else {
          *(int *)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                      *)(local_38._M_p + 8))->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                   )._M_impl.super__Vector_impl_data._M_start =
               *(int *)&(((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                           *)(local_38._M_p + 8))->
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + 1;
        }
      }
      pCStack_78 = pCVar15;
      SwitchStmt::add_switch_case
                ((SwitchStmt *)state_name.field_2._8_8_,
                 (shared_ptr<kratos::Const> *)&stack0xffffffffffffff88,
                 (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)auStack_138);
      if (iter != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
      }
      this_00 = this->generator_;
      pCStack_78 = (Context *)(this->fsm_name_)._M_dataplus._M_p;
      iter = (Var *)(this->fsm_name_)._M_string_length;
      local_68 = psStack_b8;
      p_Stack_60 = (_Base_ptr)state_name._M_dataplus._M_p;
      format_str.size_ = 0xdd;
      format_str.data_ = (char *)0xe;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffff88;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &stmts.
                  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)"{0}_{1}_Output",
                 format_str,args);
      Stmt::as<kratos::ScopedStmtBlock>((Stmt *)local_100);
      pCStack_78 = (Context *)local_100._0_8_;
      iter = (Var *)local_100._8_8_;
      local_100._0_8_ = (Enum *)0x0;
      local_100._8_8_ = (Var *)0x0;
      Generator::add_named_block
                (this_00,(string *)
                         &stmts.
                          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                 (shared_ptr<kratos::StmtBlock> *)&stack0xffffffffffffff88);
      if (iter != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iter);
      }
      if ((Var *)local_100._8_8_ != (Var *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_100._8_8_);
      }
      if (stmts.
          super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage !=
          (pointer)&stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount) {
        operator_delete(stmts.
                        super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (ulong)((long)&(stmt.
                                        super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
      }
    }
    if (states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
      operator_delete(states.
                      super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,
                      -(long)states.
                             super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)auStack_138);
    if (psStack_b8 != &state_name._M_string_length) {
      operator_delete(psStack_b8,
                      CONCAT71(state_name._M_string_length._1_7_,
                               (undefined1)state_name._M_string_length) + 1);
    }
    if ((Var *)local_38._M_p != (Var *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._M_p);
    }
    _Var8._M_pi = output_comb.
                  super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
    auVar12 = (undefined1  [8])
              &(output_comb.
                super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count;
    ppFVar9 = states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
    super__Vector_impl_data._M_start = ppFVar11;
  } while( true );
}

Assistant:

void FSM::generate_output(Enum& enum_def, EnumVar& current_state,
                          const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto output_comb = generator_->combinational();
    auto output_case_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    // need to deal with fully specified case where default is the same as start state
    // also default case
    if (!is_2_power(enum_def.values.size())) {
        states.emplace_back(nullptr);
    }

    for (auto* state : states) {
        std::shared_ptr<EnumConst> state_enum;
        std::string state_name;
        if (state) {
            state_name = state_name_mapping.at(state);
            state_enum = enum_def.get_enum(state_name);
        } else {
            state_name = "default";
            state_enum = nullptr;
            // use default state outputs
            state = start_state_.get();
        }

        std::vector<std::shared_ptr<Stmt>> stmts;
        auto const& output_values = state->output_values();
        auto const& output_ordering = state->output_ordering();
        stmts.reserve(output_values.size());
        // sort the names
        std::vector<Var*> vars;
        vars.reserve(output_values.size());
        for (auto* iter : output_ordering) vars.emplace_back(iter);
        for (auto const& output_var : vars) {
            auto* value = output_values.at(output_var);
            if (value && value != output_var) {
                // value can be a nullptr
                // users may use the same variable to indicate not changed
                auto stmt = output_var->assign(value->shared_from_this());
                if (generator_->debug) {
                    auto debug_info = state->output_fn_ln();
                    if (debug_info.find(output_var) != debug_info.end())
                        stmt->fn_name_ln.emplace_back(debug_info.at(output_var));
                }
                stmts.emplace_back(stmt);
            }
        }
        // add it to the case
        if (!stmts.empty()) {
            auto& case_stmt = output_case_comb->add_switch_case(state_enum, stmts);
            generator_->add_named_block(::format("{0}_{1}_Output", fsm_name_, state_name),
                                        case_stmt.as<ScopedStmtBlock>());
        }
    }

    // add it to the output_comb
    output_comb->add_stmt(output_case_comb);
}